

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x1_010.c
# Opt level: O3

void device_reset_x1_010(void *chip)

{
  x1_010_state *info;
  
  memset((void *)((long)chip + 0x1c),0,0x2080);
  return;
}

Assistant:

static void device_reset_x1_010(void *chip)
{
	x1_010_state *info = (x1_010_state *)chip;
	
	memset(info->reg, 0, 0x2000);
//	memset(HI_WORD_BUF, 0, sizeof(m_HI_WORD_BUF));
	memset(info->smp_offset, 0, SETA_NUM_CHANNELS * sizeof(UINT32));
	memset(info->env_offset, 0, SETA_NUM_CHANNELS * sizeof(UINT32));
	
	return;
}